

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node,uchar **dst,
                   size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  vector_brodnik<unsigned_char_*> *this;
  bool bVar1;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node_00;
  size_t sVar2;
  uint index;
  
  for (index = 0;
      (ulong)index <
      (ulong)((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); index = index + 1) {
    bVar1 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::is_trie(node,index);
    if (bVar1) {
      node_00 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node(node,index);
      dst = traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    else {
      this = (vector_brodnik<unsigned_char_*> *)
             (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[index];
      if (this != (vector_brodnik<unsigned_char_*> *)0x0) {
        sVar2 = vector_brodnik<unsigned_char_*>::size(this);
        copy<unsigned_char*,unsigned_char**>(this,dst);
        if ((char)index != '\0') {
          mkqsort(dst,(int)sVar2,(int)depth);
        }
        dst = dst + sVar2;
        vector_brodnik<unsigned_char_*>::~vector_brodnik(this);
        operator_delete(this);
      }
    }
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)node);
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}